

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O3

void __thiscall
dlib::message_box_helper::blocking_box_win::blocking_box_win
          (blocking_box_win *this,wstring *title_,wstring *message_)

{
  pointer pwVar1;
  
  drawable_window::drawable_window(&this->super_drawable_window,false,false);
  (this->super_drawable_window).super_base_window._vptr_base_window =
       (_func_int **)&PTR__blocking_box_win_00314548;
  (this->title)._M_dataplus._M_p = (pointer)&(this->title).field_2;
  pwVar1 = (title_->_M_dataplus)._M_p;
  std::__cxx11::wstring::_M_construct<wchar_t*>
            ((wstring *)&this->title,pwVar1,pwVar1 + title_->_M_string_length);
  (this->message)._M_dataplus._M_p = (pointer)&(this->message).field_2;
  pwVar1 = (message_->_M_dataplus)._M_p;
  std::__cxx11::wstring::_M_construct<wchar_t*>
            ((wstring *)&this->message,pwVar1,pwVar1 + message_->_M_string_length);
  label::label(&this->msg,&this->super_drawable_window);
  button::button(&this->btn_ok,&this->super_drawable_window);
  initialize(this);
  return;
}

Assistant:

blocking_box_win::
        blocking_box_win (
            const std::wstring& title_,
            const std::wstring& message_
        ) : 
            drawable_window(false),
            title(title_),
            message(message_),
            msg(*this),
            btn_ok(*this)
        {
            initialize();
        }